

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

void __thiscall helics::Input::setDefaultBytes(Input *this,data_view *val)

{
  data_view *in_RDI;
  Input *inp;
  ValueFederate *in_stack_ffffffffffffffc0;
  
  inp = (Input *)&stack0xffffffffffffffd0;
  data_view::data_view
            (in_RDI,(data_view *)
                    in_RDI[1].ref.
                    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  helics::ValueFederate::setDefaultValue(in_stack_ffffffffffffffc0,inp,in_RDI);
  data_view::~data_view((data_view *)0x3c075e);
  return;
}

Assistant:

void Input::setDefaultBytes(data_view val)
{
    fed->setDefaultValue(*this, std::move(val));
}